

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlGetObjectBool(JlDataObject *BoolObject,_Bool *pBoolValue)

{
  JL_STATUS JVar1;
  _Bool _Var2;
  
  if (pBoolValue != (_Bool *)0x0 && BoolObject != (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_SUCCESS;
    if (BoolObject->Type == JL_DATA_TYPE_BOOL) {
      _Var2 = (BoolObject->field_2).Boolean;
    }
    else {
      JVar1 = JL_STATUS_WRONG_TYPE;
      _Var2 = false;
    }
    *pBoolValue = _Var2;
    return JVar1;
  }
  return JL_STATUS_INVALID_PARAMETER;
}

Assistant:

JL_STATUS
    JlGetObjectBool
    (
        JlDataObject const* BoolObject,
        bool*               pBoolValue
    )
{
    JL_STATUS jlStatus;

    if(     NULL != BoolObject
        &&  NULL != pBoolValue )
    {
        if( JL_DATA_TYPE_BOOL == BoolObject->Type )
        {
            *pBoolValue = BoolObject->Boolean;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            *pBoolValue = false;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}